

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

shared_ptr<adios2::core::Engine>
adios2::core::IO::MakeEngine<adios2::core::engine::BP3Writer>
          (IO *io,string *name,Mode mode,Comm *comm)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<adios2::core::Engine> sVar2;
  undefined1 local_1c [4];
  ADIOS *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_1c = SUB84(comm,0);
  std::
  make_shared<adios2::core::engine::BP3Writer,adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode_const&,adios2::helper::Comm>
            ((IO *)&stack0xffffffffffffffe8,name,(Mode *)CONCAT44(in_register_00000014,mode),
             (Comm *)local_1c);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  io->m_ADIOS = local_18;
  (io->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_18 = (ADIOS *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)io;
  return (shared_ptr<adios2::core::Engine>)
         sVar2.super___shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Engine> MakeEngine(IO &io, const std::string &name, const Mode mode,
                                              helper::Comm comm)
    {
        return std::make_shared<T>(io, name, mode, std::move(comm));
    }